

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QWindowSystemInterface::TouchPoint>::
emplace<QWindowSystemInterface::TouchPoint_const&>
          (QGenericArrayOps<QWindowSystemInterface::TouchPoint> *this,qsizetype i,TouchPoint *args)

{
  TouchPoint **ppTVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  Data *pDVar4;
  undefined4 uVar5;
  QPointF *pQVar6;
  qsizetype qVar7;
  long lVar8;
  long lVar9;
  undefined8 *puVar10;
  TouchPoint *pTVar11;
  TouchPoint *pTVar12;
  TouchPoint *pTVar13;
  long in_FS_OFFSET;
  bool bVar14;
  byte bVar15;
  TouchPoint tmp;
  Inserter local_f0;
  TouchPoint local_a0;
  long local_28;
  
  bVar15 = 0;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_002e0152:
    puVar10 = &DAT_00690de8;
    pTVar11 = &local_a0;
    for (lVar8 = 0xf; lVar8 != 0; lVar8 = lVar8 + -1) {
      *(undefined8 *)pTVar11 = *puVar10;
      puVar10 = puVar10 + 1;
      pTVar11 = (TouchPoint *)&pTVar11->uniqueId;
    }
    pTVar11 = args;
    pTVar12 = &local_a0;
    for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
      uVar5 = *(undefined4 *)&pTVar11->field_0x4;
      pTVar12->id = pTVar11->id;
      *(undefined4 *)&pTVar12->field_0x4 = uVar5;
      pTVar11 = (TouchPoint *)&pTVar11->uniqueId;
      pTVar12 = (TouchPoint *)&pTVar12->uniqueId;
    }
    local_a0.velocity.v[1] = (args->velocity).v[1];
    local_a0.rawPositions.d.d = (args->rawPositions).d.d;
    local_a0.rawPositions.d.ptr = (args->rawPositions).d.ptr;
    local_a0.rawPositions.d.size = (args->rawPositions).d.size;
    if (&(local_a0.rawPositions.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_a0.rawPositions.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_a0.rawPositions.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar14 = (this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).size != 0;
    QArrayDataPointer<QWindowSystemInterface::TouchPoint>::detachAndGrow
              (&this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>,
               (uint)(i == 0 && bVar14),1,(TouchPoint **)0x0,
               (QArrayDataPointer<QWindowSystemInterface::TouchPoint> *)0x0);
    qVar7 = local_a0.rawPositions.d.size;
    pQVar6 = local_a0.rawPositions.d.ptr;
    pDVar4 = local_a0.rawPositions.d.d;
    if (i == 0 && bVar14) {
      pTVar11 = (this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).ptr;
      pTVar12 = &local_a0;
      pTVar13 = pTVar11 + -1;
      for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
        uVar5 = *(undefined4 *)&pTVar12->field_0x4;
        pTVar13->id = pTVar12->id;
        *(undefined4 *)&pTVar13->field_0x4 = uVar5;
        pTVar12 = (TouchPoint *)((long)pTVar12 + ((ulong)bVar15 * -2 + 1) * 8);
        pTVar13 = (TouchPoint *)((long)pTVar13 + (ulong)bVar15 * -0x10 + 8);
      }
      pTVar11[-1].velocity.v[1] = local_a0.velocity.v[1];
      local_a0.rawPositions.d.d = (Data *)0x0;
      pTVar11[-1].rawPositions.d.d = pDVar4;
      local_a0.rawPositions.d.ptr = (QPointF *)0x0;
      pTVar11[-1].rawPositions.d.ptr = pQVar6;
      local_a0.rawPositions.d.size = 0;
      pTVar11[-1].rawPositions.d.size = qVar7;
      ppTVar1 = &(this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).ptr;
      *ppTVar1 = *ppTVar1 + -1;
      pqVar2 = &(this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      local_f0.sourceCopyConstruct = 0;
      local_f0.nSource = 0;
      local_f0.move = 0;
      local_f0.sourceCopyAssign = 0;
      local_f0.end = (TouchPoint *)0x0;
      local_f0.last = (TouchPoint *)0x0;
      local_f0.where = (TouchPoint *)0x0;
      local_f0.begin = (this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).ptr;
      local_f0.size = (this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).size;
      local_f0.data = &this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>;
      Inserter::insertOne(&local_f0,i,&local_a0);
      (local_f0.data)->ptr = local_f0.begin;
      (local_f0.data)->size = local_f0.size;
    }
    if (&(local_a0.rawPositions.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a0.rawPositions.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a0.rawPositions.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_a0.rawPositions.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        QArrayData::deallocate(&(local_a0.rawPositions.d.d)->super_QArrayData,0x10,0x10);
      }
    }
  }
  else {
    lVar8 = (this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).size;
    if ((lVar8 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar8 !=
        ((long)((long)(this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0x1111111111111111)) {
      pTVar11 = (this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).ptr;
      pTVar11[lVar8].velocity.v[1] = (args->velocity).v[1];
      pTVar12 = args;
      pTVar13 = pTVar11 + lVar8;
      for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
        uVar5 = *(undefined4 *)&pTVar12->field_0x4;
        pTVar13->id = pTVar12->id;
        *(undefined4 *)&pTVar13->field_0x4 = uVar5;
        pTVar12 = (TouchPoint *)&pTVar12->uniqueId;
        pTVar13 = (TouchPoint *)&pTVar13->uniqueId;
      }
      pDVar4 = (args->rawPositions).d.d;
      pTVar11[lVar8].rawPositions.d.d = pDVar4;
      pTVar11[lVar8].rawPositions.d.ptr = (args->rawPositions).d.ptr;
      pTVar11[lVar8].rawPositions.d.size = (args->rawPositions).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((TouchPoint *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
          == (this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).ptr))
      goto LAB_002e0152;
      pTVar11 = (this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).ptr;
      pTVar12 = args;
      pTVar13 = pTVar11 + -1;
      for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
        uVar5 = *(undefined4 *)&pTVar12->field_0x4;
        pTVar13->id = pTVar12->id;
        *(undefined4 *)&pTVar13->field_0x4 = uVar5;
        pTVar12 = (TouchPoint *)&pTVar12->uniqueId;
        pTVar13 = (TouchPoint *)&pTVar13->uniqueId;
      }
      pTVar11[-1].velocity.v[1] = (args->velocity).v[1];
      pDVar4 = (args->rawPositions).d.d;
      pTVar11[-1].rawPositions.d.d = pDVar4;
      pTVar11[-1].rawPositions.d.ptr = (args->rawPositions).d.ptr;
      pTVar11[-1].rawPositions.d.size = (args->rawPositions).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ppTVar1 = &(this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).ptr;
      *ppTVar1 = *ppTVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }